

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

Elem * new_utf8_char(Grammar *g,char *s,char *e,Rule *r)

{
  byte bVar1;
  Elem *pEVar2;
  Elem *x;
  unsigned_long len;
  unsigned_long base;
  unsigned_long utf32_code;
  Rule *pRStack_28;
  char utf8_code [4];
  Rule *r_local;
  char *e_local;
  char *s_local;
  Grammar *g_local;
  
  x = (Elem *)0x0;
  base = 0;
  len = 1;
  r_local = (Rule *)e;
  while ((Rule *)(s + 3) <= r_local) {
    r_local = (Rule *)((long)&r_local[-1].same_reduction + 7);
    if (((char)r_local->index < '0') || ('9' < (char)r_local->index)) {
      if (((char)r_local->index < 'a') || ('f' < (char)r_local->index)) {
        if (('@' < (char)r_local->index) && ((char)r_local->index < 'G')) {
          base = len * (long)((char)r_local->index + -0x37) + base;
        }
      }
      else {
        base = len * (long)((char)r_local->index + -0x57) + base;
      }
    }
    else {
      base = len * (long)((char)r_local->index + -0x30) + base;
    }
    len = len << 4;
  }
  bVar1 = (byte)base;
  pRStack_28 = r;
  if (base < 0x80) {
    x = (Elem *)0x1;
    utf32_code._4_1_ = bVar1;
  }
  else if (base < 0x800) {
    utf32_code._4_1_ = (byte)(base >> 6) & 0x1f | 0xc0;
    utf32_code._5_1_ = bVar1 & 0x3f | 0x80;
    x = (Elem *)0x2;
  }
  else if (base < 0x10000) {
    utf32_code._4_1_ = (byte)(base >> 0xc) & 0xf | 0xe0;
    utf32_code._5_1_ = (byte)(base >> 6) & 0x3f | 0x80;
    utf32_code._6_1_ = bVar1 & 0x3f | 0x80;
    x = (Elem *)0x3;
  }
  else if (base < 0x2000000) {
    utf32_code._4_1_ = (byte)(base >> 0x12) & 7 | 0xf0;
    utf32_code._5_1_ = (byte)(base >> 0xc) & 0x3f | 0x80;
    utf32_code._6_1_ = (byte)(base >> 6) & 0x3f | 0x80;
    utf32_code._7_1_ = bVar1 & 0x3f | 0x80;
    x = (Elem *)0x4;
  }
  else {
    d_fail("UTF32 Unicode value U+%8X too large for valid UTF-8 encoding (cf. Unicode Spec 4.0, section 3.9)"
           ,base);
  }
  pEVar2 = new_term_string(g,(char *)((long)&utf32_code + 4),
                           (char *)((long)&x->index + (long)&utf32_code),pRStack_28);
  ((pEVar2->e).term)->kind = TERM_STRING;
  return pEVar2;
}

Assistant:

Elem *new_utf8_char(Grammar *g, char *s, char *e, Rule *r) {
  char utf8_code[4];
  unsigned long utf32_code, base, len = 0;
  Elem *x;
  for (utf32_code = 0, base = 1; e >= s + 3; base *= 16) {
    e--;
    if (*e >= '0' && *e <= '9')
      utf32_code += base * (*e - '0');
    else if (*e >= 'a' && *e <= 'f')
      utf32_code += base * (*e - 'a' + 10);
    else if (*e >= 'A' && *e <= 'F')
      utf32_code += base * (*e - 'A' + 10);
  }
  if (utf32_code < 0x80) {
    utf8_code[0] = utf32_code;
    len = 1;
  } else if (utf32_code < 0x800) {
    utf8_code[0] = 0xc0 | ((utf32_code >> 6) & 0x1f);
    utf8_code[1] = 0x80 | (utf32_code & 0x3f);
    len = 2;
  } else if (utf32_code < 0x10000) {
    utf8_code[0] = 0xe0 | ((utf32_code >> 12) & 0x0f);
    utf8_code[1] = 0x80 | ((utf32_code >> 6) & 0x3f);
    utf8_code[2] = 0x80 | (utf32_code & 0x3f);
    len = 3;
  } else if (utf32_code < 0x02000000) {
    utf8_code[0] = 0xf0 | ((utf32_code >> 18) & 0x07);
    utf8_code[1] = 0x80 | ((utf32_code >> 12) & 0x3f);
    utf8_code[2] = 0x80 | ((utf32_code >> 6) & 0x3f);
    utf8_code[3] = 0x80 | (utf32_code & 0x3f);
    len = 4;
  } else {
    d_fail("UTF32 Unicode value U+%8X too large for valid UTF-8 encoding (cf. Unicode Spec 4.0, section 3.9)",
           utf32_code);
  }
  x = new_term_string(g, utf8_code, utf8_code + len, r);
  x->e.term->kind = TERM_STRING;
  return x;
}